

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O1

double SRCTools::IIRResampler::getPassbandFractionForQuality(Quality quality)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (quality - FAST < 3) {
    dVar1 = *(double *)(&DAT_0019fe18 + (ulong)(quality - FAST) * 8);
  }
  return dVar1;
}

Assistant:

double IIRResampler::getPassbandFractionForQuality(Quality quality) {
	switch (quality) {
	case FAST:
		return 0.5;
	case GOOD:
		return 0.7708;
	case BEST:
		return 0.9524;
	default:
		return 0;
	}
}